

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O3

int compare_map_idx_pair_asc(void *a,void *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = *(int *)((long)a + 4);
  iVar1 = *(int *)((long)b + 4);
  iVar3 = ((iVar1 < iVar2) - 1) + (uint)(iVar1 < iVar2);
  if (iVar2 == iVar1) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int compare_map_idx_pair_asc(const void *a, const void *b) {
  if (((RefBufMapData *)a)->disp_order == ((RefBufMapData *)b)->disp_order) {
    return 0;
  } else if (((const RefBufMapData *)a)->disp_order >
             ((const RefBufMapData *)b)->disp_order) {
    return 1;
  } else {
    return -1;
  }
}